

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void **srcPtr,size_t *srcSizePtr)

{
  void *src;
  undefined1 *puVar1;
  uint uVar2;
  U32 UVar3;
  ZSTD_DCtx *code;
  size_t sVar4;
  BYTE *src_00;
  XXH64_hash_t XVar5;
  U32 checkRead;
  U32 checkCalc;
  size_t cBlockSize;
  int local_80;
  blockProperties_t blockProperties;
  size_t decodedSize;
  size_t errcod;
  size_t frameHeaderSize;
  size_t remainingSrcSize;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  BYTE *ip;
  size_t *srcSizePtr_local;
  void **srcPtr_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_DCtx *dctx_local;
  
  src = *srcPtr;
  puVar1 = (undefined1 *)*srcSizePtr;
  if (puVar1 < (undefined1 *)0x9) {
    dctx_local = (ZSTD_DCtx *)0xffffffffffffffb8;
  }
  else {
    code = (ZSTD_DCtx *)ZSTD_frameHeaderSize(src,5);
    uVar2 = ERR_isError((size_t)code);
    dctx_local = code;
    if (uVar2 == 0) {
      if (puVar1 < (undefined1 *)((long)&code->LLTptr + 3U)) {
        dctx_local = (ZSTD_DCtx *)0xffffffffffffffb8;
      }
      else {
        dctx_local = (ZSTD_DCtx *)ZSTD_decodeFrameHeader(dctx,src,(size_t)code);
        uVar2 = ERR_isError((size_t)dctx_local);
        if (uVar2 == 0) {
          ostart = (BYTE *)((long)src + (long)(&code->entropy + -1) + 0x6808);
          frameHeaderSize = (long)puVar1 - (long)code;
          remainingSrcSize = (size_t)dst;
          do {
            sVar4 = ZSTD_getcBlockSize(ostart,frameHeaderSize,
                                       (blockProperties_t *)((long)&cBlockSize + 4));
            uVar2 = ERR_isError(sVar4);
            if (uVar2 != 0) {
              return sVar4;
            }
            src_00 = ostart + 3;
            if (frameHeaderSize - 3 < sVar4) {
              return 0xffffffffffffffb8;
            }
            switch(cBlockSize._4_4_) {
            case 0:
              blockProperties._4_8_ =
                   ZSTD_copyRawBlock((void *)remainingSrcSize,
                                     (long)dst + (dstCapacity - remainingSrcSize),src_00,sVar4);
              break;
            case 1:
              blockProperties._4_8_ =
                   ZSTD_setRleBlock((void *)remainingSrcSize,
                                    (long)dst + (dstCapacity - remainingSrcSize),*src_00,
                                    (ulong)blockProperties.blockType);
              break;
            case 2:
              blockProperties._4_8_ =
                   ZSTD_decompressBlock_internal
                             (dctx,(void *)remainingSrcSize,
                              (long)dst + (dstCapacity - remainingSrcSize),src_00,sVar4,1);
              break;
            case 3:
            default:
              return 0xffffffffffffffec;
            }
            uVar2 = ERR_isError(blockProperties._4_8_);
            if (uVar2 != 0) {
              sVar4._0_4_ = blockProperties.lastBlock;
              sVar4._4_4_ = blockProperties.origSize;
              return sVar4;
            }
            if ((dctx->fParams).checksumFlag != 0) {
              XXH64_update(&dctx->xxhState,(void *)remainingSrcSize,blockProperties._4_8_);
            }
            remainingSrcSize = blockProperties._4_8_ + remainingSrcSize;
            ostart = src_00 + sVar4;
            frameHeaderSize = (frameHeaderSize - 3) - sVar4;
          } while (local_80 == 0);
          if (((dctx->fParams).frameContentSize == 0xffffffffffffffff) ||
             (remainingSrcSize - (long)dst == (dctx->fParams).frameContentSize)) {
            if ((dctx->fParams).checksumFlag != 0) {
              XVar5 = XXH64_digest(&dctx->xxhState);
              if (frameHeaderSize < 4) {
                return 0xffffffffffffffea;
              }
              UVar3 = MEM_readLE32(ostart);
              if (UVar3 != (U32)XVar5) {
                return 0xffffffffffffffea;
              }
              ostart = ostart + 4;
              frameHeaderSize = frameHeaderSize - 4;
            }
            *srcPtr = ostart;
            *srcSizePtr = frameHeaderSize;
            dctx_local = (ZSTD_DCtx *)(remainingSrcSize - (long)dst);
          }
          else {
            dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
          }
        }
      }
    }
  }
  return (size_t)dctx_local;
}

Assistant:

static size_t ZSTD_decompressFrame(ZSTD_DCtx* dctx,
                                   void* dst, size_t dstCapacity,
                             const void** srcPtr, size_t *srcSizePtr)
{
    const BYTE* ip = (const BYTE*)(*srcPtr);
    BYTE* const ostart = (BYTE* const)dst;
    BYTE* const oend = ostart + dstCapacity;
    BYTE* op = ostart;
    size_t remainingSrcSize = *srcSizePtr;

    DEBUGLOG(4, "ZSTD_decompressFrame (srcSize:%i)", (int)*srcSizePtr);

    /* check */
    if (remainingSrcSize < ZSTD_FRAMEHEADERSIZE_MIN+ZSTD_blockHeaderSize)
        return ERROR(srcSize_wrong);

    /* Frame Header */
    {   size_t const frameHeaderSize = ZSTD_frameHeaderSize(ip, ZSTD_FRAMEHEADERSIZE_PREFIX);
        if (ZSTD_isError(frameHeaderSize)) return frameHeaderSize;
        if (remainingSrcSize < frameHeaderSize+ZSTD_blockHeaderSize)
            return ERROR(srcSize_wrong);
        CHECK_F( ZSTD_decodeFrameHeader(dctx, ip, frameHeaderSize) );
        ip += frameHeaderSize; remainingSrcSize -= frameHeaderSize;
    }

    /* Loop on each block */
    while (1) {
        size_t decodedSize;
        blockProperties_t blockProperties;
        size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSrcSize, &blockProperties);
        if (ZSTD_isError(cBlockSize)) return cBlockSize;

        ip += ZSTD_blockHeaderSize;
        remainingSrcSize -= ZSTD_blockHeaderSize;
        if (cBlockSize > remainingSrcSize) return ERROR(srcSize_wrong);

        switch(blockProperties.blockType)
        {
        case bt_compressed:
            decodedSize = ZSTD_decompressBlock_internal(dctx, op, oend-op, ip, cBlockSize, /* frame */ 1);
            break;
        case bt_raw :
            decodedSize = ZSTD_copyRawBlock(op, oend-op, ip, cBlockSize);
            break;
        case bt_rle :
            decodedSize = ZSTD_setRleBlock(op, oend-op, *ip, blockProperties.origSize);
            break;
        case bt_reserved :
        default:
            return ERROR(corruption_detected);
        }

        if (ZSTD_isError(decodedSize)) return decodedSize;
        if (dctx->fParams.checksumFlag)
            XXH64_update(&dctx->xxhState, op, decodedSize);
        op += decodedSize;
        ip += cBlockSize;
        remainingSrcSize -= cBlockSize;
        if (blockProperties.lastBlock) break;
    }

    if (dctx->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN) {
        if ((U64)(op-ostart) != dctx->fParams.frameContentSize) {
            return ERROR(corruption_detected);
    }   }
    if (dctx->fParams.checksumFlag) { /* Frame content checksum verification */
        U32 const checkCalc = (U32)XXH64_digest(&dctx->xxhState);
        U32 checkRead;
        if (remainingSrcSize<4) return ERROR(checksum_wrong);
        checkRead = MEM_readLE32(ip);
        if (checkRead != checkCalc) return ERROR(checksum_wrong);
        ip += 4;
        remainingSrcSize -= 4;
    }

    /* Allow caller to get size read */
    *srcPtr = ip;
    *srcSizePtr = remainingSrcSize;
    return op-ostart;
}